

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralizedMAAStarPlanner.cpp
# Opt level: O2

void __thiscall GeneralizedMAAStarPlanner::Plan(GeneralizedMAAStarPlanner *this)

{
  shared_ptr<JointPolicyDiscretePure> *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  size_type __n;
  ulong uVar1;
  pointer puVar2;
  pointer puVar3;
  undefined1 auVar4 [16];
  element_type *peVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  long lVar8;
  ostream *poVar9;
  undefined4 extraout_var_00;
  reference pvVar10;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  EDeadline *this_02;
  shared_count *this_03;
  pointer puVar11;
  pointer puVar12;
  double dVar13;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  bool cleanUpPPI;
  ostream *local_4c0;
  PartialPolicyPoolInterface_sharedPtr pp_p;
  shared_ptr<PartialJointPolicyDiscretePure> bestJPol;
  PartialPolicyPoolInterface_sharedPtr poolOfNextPolicies;
  PartialPolicyPoolItemInterface_sharedPtr bestRanked_ppi;
  element_type *local_458;
  shared_count local_450;
  element_type *local_448;
  shared_count local_440;
  element_type *local_438;
  shared_count sStack_430;
  element_type *local_428;
  shared_count sStack_420;
  ofstream *local_418;
  clock_t local_410;
  ostream *local_408;
  string *local_400;
  double local_3f8;
  long *local_3f0;
  shared_count local_3e8;
  shared_ptr<PartialJointPolicyDiscretePure> jpol_sel;
  string local_3c0;
  stringstream ss;
  shared_count local_398;
  ostream local_390 [376];
  PartialPolicyPoolItemInterface_sharedPtr ppi;
  ostream local_208 [376];
  tms ts_after;
  tms ts_before;
  tms ts_start;
  
  Initialize(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"GMAA::Plan",(allocator<char> *)&ppi);
  TimedAlgorithm::StartTimer(&this->super_TimedAlgorithm,(string *)&ss);
  std::__cxx11::string::~string((string *)&ss);
  local_410 = times((tms *)&ts_start);
  local_418 = this->_m_intermediateResultFile;
  times((tms *)&ts_before);
  (*(this->super_TimedAlgorithm)._vptr_TimedAlgorithm[7])(&bestJPol,this);
  ((bestJPol.px)->super_PartialJointPolicy)._m_pastReward = -1.79769313486232e+308;
  (*(this->super_TimedAlgorithm)._vptr_TimedAlgorithm[5])(&pp_p,this);
  peVar5 = pp_p.px;
  iVar6 = (*(this->super_TimedAlgorithm)._vptr_TimedAlgorithm[2])(this);
  (*peVar5->_vptr_PartialPolicyPoolInterface[3])(peVar5,CONCAT44(extraout_var,iVar6));
  local_400 = &this->_m_intermediateTimingFilename;
  this_01 = &this->_m_expanded_childs;
  do {
    if (this->_m_deadline != 0) {
      times((tms *)&ts_after);
      local_4c0 = (ostream *)(double)(ts_after.tms_utime - ts_before.tms_utime);
      lVar8 = sysconf(2);
      auVar4._8_8_ = in_XMM2_Qb;
      auVar4._0_8_ = in_XMM2_Qa;
      auVar4 = vcvtusi2sd_avx512f(auVar4,this->_m_deadline);
      if (auVar4._0_8_ < (double)local_4c0 / (double)lVar8) {
        local_4c0 = (ostream *)((double)local_4c0 / (double)lVar8);
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        std::operator<<(local_390,"GeneralizedMAAStarPlanner::Plan() we spent ");
        poVar9 = std::ostream::_M_insert<double>((double)local_4c0);
        poVar9 = std::operator<<(poVar9,"s, which is more than the deadline of ");
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        std::operator<<(poVar9,"s, bailing out...");
        std::__cxx11::stringbuf::str();
        EDeadline::EDeadline((EDeadline *)&ppi,&local_3c0,0.0);
        std::__cxx11::string::~string((string *)&local_3c0);
        this_02 = (EDeadline *)__cxa_allocate_exception(0x30);
        EDeadline::EDeadline(this_02,(EDeadline *)&ppi);
        __cxa_throw(this_02,&EDeadline::typeinfo,E::~E);
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ss,"GMAA::Plan::iteration",(allocator<char> *)&ppi);
    TimedAlgorithm::StartTimer(&this->super_TimedAlgorithm,(string *)&ss);
    dVar13 = (double)std::__cxx11::string::~string((string *)&ss);
    if (this->_m_saveIntermediateTiming == true) {
      TimedAlgorithm::SaveTimers(&this->super_TimedAlgorithm,local_400);
    }
    if (1 < this->_m_verboseness) {
      std::operator<<((ostream *)&std::cout,
                      "\n---------------------------------------------------\n");
      poVar9 = std::operator<<((ostream *)&std::cout,
                               "-->>Start of new GMAA iteration, polpool size=");
      (*(pp_p.px)->_vptr_PartialPolicyPoolInterface[0xb])();
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      poVar9 = std::operator<<(poVar9,"<<--");
      std::endl<char,std::char_traits<char>>(poVar9);
    }
    (*(pp_p.px)->_vptr_PartialPolicyPoolInterface[4])(&ppi);
    (*(ppi.px)->_vptr_PartialPolicyPoolItemInterface[2])(&jpol_sel);
    (*(ppi.px)->_vptr_PartialPolicyPoolItemInterface[3])();
    __n = ((jpol_sel.px)->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy
          ._m_depth;
    local_4c0 = (ostream *)dVar13;
    if (2 < this->_m_verboseness) {
      poVar9 = std::operator<<((ostream *)&std::cout,"GMAA Selected a partial jpol of depth=");
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      std::operator<<(poVar9," and heur. val=");
      poVar9 = std::ostream::_M_insert<double>((double)local_4c0);
      poVar9 = std::operator<<(poVar9," to expand");
      std::endl<char,std::char_traits<char>>(poVar9);
      if (3 < this->_m_verboseness) {
        (*(ppi.px)->_vptr_PartialPolicyPoolItemInterface[2])((tms *)&ss);
        (**(code **)(*(long *)_ss + 0x38))();
        boost::detail::shared_count::~shared_count(&local_398);
      }
    }
    local_3f8 = this->_m_maxLowerBound;
    poVar9 = (ostream *)((double)local_4c0 + this->_m_slack);
    local_4c0 = poVar9;
    if ((double)poVar9 < local_3f8) {
      if (-1 < this->_m_verboseness) {
        std::operator<<((ostream *)&std::cout,
                        "!!!GMAA::Plan highest upper < best found lower bound, stopping\n");
      }
    }
    else {
      (*(this->super_TimedAlgorithm)._vptr_TimedAlgorithm[5])(&poolOfNextPolicies,this);
      cleanUpPPI = true;
      uVar7 = (*(this->super_TimedAlgorithm)._vptr_TimedAlgorithm[3])
                        (this,&ppi,&poolOfNextPolicies,&cleanUpPPI);
      if ((ulong)((long)(this->_m_expanded_childs).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(this->_m_expanded_childs).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) <= __n) {
        _ss = (pointer)0x0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                  (this_01,__n + 1,(value_type_conflict2 *)&ss);
      }
      iVar6 = (*(poolOfNextPolicies.px)->_vptr_PartialPolicyPoolInterface[0xb])();
      pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at(this_01,__n);
      *pvVar10 = *pvVar10 + CONCAT44(extraout_var_00,iVar6);
      if (cleanUpPPI == true) {
        local_448 = ppi.px;
        local_440.pi_ = ppi.pn.pi_;
        if (ppi.pn.pi_ != (sp_counted_base *)0x0) {
          LOCK();
          (ppi.pn.pi_)->use_count_ = (ppi.pn.pi_)->use_count_ + 1;
          UNLOCK();
        }
        (*(pp_p.px)->_vptr_PartialPolicyPoolInterface[5])(pp_p.px,&local_448);
        this_03 = &local_440;
      }
      else {
        local_458 = ppi.px;
        local_450.pi_ = ppi.pn.pi_;
        if (ppi.pn.pi_ != (sp_counted_base *)0x0) {
          LOCK();
          (ppi.pn.pi_)->use_count_ = (ppi.pn.pi_)->use_count_ + 1;
          UNLOCK();
        }
        (*(pp_p.px)->_vptr_PartialPolicyPoolInterface[5])(pp_p.px,&local_458);
        boost::detail::shared_count::~shared_count(&local_450);
        local_428 = ppi.px;
        sStack_420.pi_ = ppi.pn.pi_;
        if (ppi.pn.pi_ != (sp_counted_base *)0x0) {
          LOCK();
          (ppi.pn.pi_)->use_count_ = (ppi.pn.pi_)->use_count_ + 1;
          UNLOCK();
        }
        poVar9 = (ostream *)ppi.px;
        (*(pp_p.px)->_vptr_PartialPolicyPoolInterface[8])(pp_p.px,&local_428);
        this_03 = &sStack_420;
      }
      boost::detail::shared_count::~shared_count(this_03);
      if ((char)uVar7 != '\0') {
        iVar6 = (*(poolOfNextPolicies.px)->_vptr_PartialPolicyPoolInterface[0xb])();
        if (CONCAT44(extraout_var_01,iVar6) != 0) {
          (*(poolOfNextPolicies.px)->_vptr_PartialPolicyPoolInterface[6])(&bestRanked_ppi);
          (*(poolOfNextPolicies.px)->_vptr_PartialPolicyPoolInterface[7])();
          (*(bestRanked_ppi.px)->_vptr_PartialPolicyPoolItemInterface[3])();
          if (this->_m_maxLowerBound < (double)poVar9) {
            this->_m_maxLowerBound = (double)poVar9;
            local_408 = poVar9;
            (*(bestRanked_ppi.px)->_vptr_PartialPolicyPoolItemInterface[2])((tms *)&ss);
            (*((bestJPol.px)->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.
              super_JointPolicy._vptr_JointPolicy[0x16])(bestJPol.px,_ss);
            boost::detail::shared_count::~shared_count(&local_398);
            if (1 < this->_m_verboseness) {
              std::operator<<((ostream *)&std::cout,"new bestJPol (and max. lowerbound) found! - ");
              std::operator<<((ostream *)&std::cout,"value v=");
              poVar9 = std::ostream::_M_insert<double>((double)local_408);
              poVar9 = std::operator<<(poVar9," - ");
              (*(bestRanked_ppi.px)->_vptr_PartialPolicyPoolItemInterface[2])(&local_3f0);
              (**(code **)(*local_3f0 + 0xa8))((tms *)&ss);
              poVar9 = std::operator<<(poVar9,(string *)&ss);
              std::endl<char,std::char_traits<char>>(poVar9);
              std::__cxx11::string::~string((string *)&ss);
              boost::detail::shared_count::~shared_count(&local_3e8);
              if (3 < this->_m_verboseness) {
                poVar9 = std::operator<<((ostream *)&std::cout,"new bestJPol->SoftPrint():");
                (*((bestJPol.px)->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.
                  super_JointPolicy._vptr_JointPolicy[6])((tms *)&ss);
                std::operator<<(poVar9,(string *)&ss);
                std::__cxx11::string::~string((string *)&ss);
              }
            }
            if (this->_m_intermediateResultFile != (ofstream *)0x0) {
              times((tms *)&ss);
              poVar9 = std::ostream::_M_insert<long>((long)local_418);
              std::operator<<(poVar9,"\t");
              poVar9 = std::ostream::_M_insert<double>(this->_m_maxLowerBound);
              std::endl<char,std::char_traits<char>>(poVar9);
            }
            (*(pp_p.px)->_vptr_PartialPolicyPoolInterface[10])
                      (this->_m_maxLowerBound - this->_m_slack);
          }
          boost::detail::shared_count::~shared_count(&bestRanked_ppi.pn);
        }
      }
      (*(this->super_TimedAlgorithm)._vptr_TimedAlgorithm[4])
                (this->_m_maxLowerBound - this->_m_slack,this,&poolOfNextPolicies,
                 (ulong)(uVar7 & 0xff));
      local_438 = poolOfNextPolicies.px;
      sStack_430.pi_ = poolOfNextPolicies.pn.pi_;
      if (poolOfNextPolicies.pn.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (poolOfNextPolicies.pn.pi_)->use_count_ = (poolOfNextPolicies.pn.pi_)->use_count_ + 1;
        UNLOCK();
      }
      (*(pp_p.px)->_vptr_PartialPolicyPoolInterface[9])(pp_p.px,&local_438);
      boost::detail::shared_count::~shared_count(&sStack_430);
      uVar1 = this->_m_maxJPolPoolSize;
      iVar6 = (*(pp_p.px)->_vptr_PartialPolicyPoolInterface[0xb])();
      if (uVar1 < CONCAT44(extraout_var_02,iVar6)) {
        iVar6 = (*(pp_p.px)->_vptr_PartialPolicyPoolInterface[0xb])();
        this->_m_maxJPolPoolSize = CONCAT44(extraout_var_03,iVar6);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ss,"GMAA::Plan::iteration",(allocator<char> *)&bestRanked_ppi);
      TimedAlgorithm::StopTimer(&this->super_TimedAlgorithm,(string *)&ss);
      std::__cxx11::string::~string((string *)&ss);
      if (1 < this->_m_verboseness) {
        if ((this->_m_maxLowerBound != -1.79769313486232e+308) || (NAN(this->_m_maxLowerBound))) {
          poVar9 = std::operator<<((ostream *)&std::cout,
                                   "--GMAA::Plan::iteration ending, polpool size=");
          (*(pp_p.px)->_vptr_PartialPolicyPoolInterface[0xb])();
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          std::operator<<(poVar9,", best policy found so far:");
          poVar9 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          (*((bestJPol.px)->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.
            super_JointPolicy._vptr_JointPolicy[0x15])((tms *)&ss);
          poVar9 = std::operator<<(poVar9,(string *)&ss);
          std::endl<char,std::char_traits<char>>(poVar9);
          std::__cxx11::string::~string((string *)&ss);
          if (4 < this->_m_verboseness) {
            poVar9 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            (*((bestJPol.px)->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.
              super_JointPolicy._vptr_JointPolicy[6])((tms *)&ss);
            poVar9 = std::operator<<(poVar9,(string *)&ss);
            std::endl<char,std::char_traits<char>>(poVar9);
            std::__cxx11::string::~string((string *)&ss);
          }
        }
        else {
          poVar9 = std::operator<<((ostream *)&std::cout,
                                   "--GMAA::Plan::iteration ending, polpool size=");
          (*(pp_p.px)->_vptr_PartialPolicyPoolInterface[0xb])();
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          std::operator<<(poVar9,", no complete policy found yet");
        }
      }
      boost::detail::shared_count::~shared_count(&poolOfNextPolicies.pn);
    }
    boost::detail::shared_count::~shared_count(&jpol_sel.pn);
    boost::detail::shared_count::~shared_count(&ppi.pn);
    if ((double)local_4c0 < local_3f8) break;
    iVar6 = (*(pp_p.px)->_vptr_PartialPolicyPoolInterface[0xb])();
  } while (CONCAT44(extraout_var_04,iVar6) != 0);
  this_00 = &this->_m_foundPolicy;
  boost::shared_ptr<JointPolicyDiscretePure>::operator=(this_00,&bestJPol);
  this->_m_expectedRewardFoundPolicy = this->_m_maxLowerBound;
  iVar6 = this->_m_verboseness;
  if (0 < iVar6) {
    std::operator<<((ostream *)&std::cout,"\n----GMAA::Plan ending, best policy found:----\n");
    (*((bestJPol.px)->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy.
      _vptr_JointPolicy[0x15])(&ss);
    poVar9 = std::operator<<((ostream *)&std::cout,(string *)&ss);
    poVar9 = std::operator<<(poVar9," = ");
    std::endl<char,std::char_traits<char>>(poVar9);
    std::__cxx11::string::~string((string *)&ss);
    if (2 < this->_m_verboseness) {
      (*(this_00->px->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy.
        _vptr_JointPolicy[6])(&ss);
      poVar9 = std::operator<<((ostream *)&std::cout,(string *)&ss);
      std::endl<char,std::char_traits<char>>(poVar9);
      std::__cxx11::string::~string((string *)&ss);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    iVar6 = this->_m_verboseness;
    if (1 < iVar6) {
      (*(this_00->px->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy.
        _vptr_JointPolicy[0x14])(&ss);
      (**(code **)(*(long *)_ss + 0x38))();
      boost::detail::shared_count::~shared_count(&local_398);
      iVar6 = this->_m_verboseness;
      if (1 < iVar6) {
        std::operator<<((ostream *)&std::cout,"\n\n ");
        iVar6 = this->_m_verboseness;
      }
    }
  }
  if (-1 < iVar6) {
    poVar9 = std::operator<<((ostream *)&std::cout,"GMAA::Plan GMAA ENDED");
    std::endl<char,std::char_traits<char>>(poVar9);
    if (1 < this->_m_verboseness) {
      std::operator<<((ostream *)&std::cout,"\n\n ");
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"GMAA::Plan",(allocator<char> *)&ppi);
  TimedAlgorithm::StopTimer(&this->super_TimedAlgorithm,(string *)&ss);
  std::__cxx11::string::~string((string *)&ss);
  if (-1 < this->_m_verboseness) {
    poVar9 = std::operator<<((ostream *)&std::cout,"Expanded nodes at different stages:\n");
    std::__cxx11::stringstream::stringstream((stringstream *)&ppi);
    puVar12 = (this->_m_expanded_childs).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar2 = (this->_m_expanded_childs).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_4c0 = poVar9;
    std::operator<<(local_208,"< ");
    for (; puVar12 != puVar2; puVar12 = puVar12 + 1) {
      if (puVar12 !=
          (this_01->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start) {
        std::operator<<(local_208,", ");
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::ostream::_M_insert<unsigned_long>((ulong)local_390);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      std::operator<<(local_208,(string *)&jpol_sel);
      std::__cxx11::string::~string((string *)&jpol_sel);
    }
    std::operator<<(local_208," >");
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)&ppi);
    poVar9 = std::operator<<(local_4c0,(string *)&poolOfNextPolicies);
    std::endl<char,std::char_traits<char>>(poVar9);
    std::__cxx11::string::~string((string *)&poolOfNextPolicies);
    poVar9 = std::operator<<((ostream *)&std::cout,
                             "Maximum number of nodes that could have been expanded:\n");
    std::__cxx11::stringstream::stringstream((stringstream *)&ppi);
    puVar11 = (this->_m_max_expanded_childs).
              super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar3 = (this->_m_max_expanded_childs).
             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_4c0 = poVar9;
    std::operator<<(local_208,"< ");
    for (; puVar11 != puVar3; puVar11 = puVar11 + 1) {
      if (puVar11 !=
          (this->_m_max_expanded_childs).
          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
          super__Vector_impl_data._M_start) {
        std::operator<<(local_208,", ");
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::ostream::_M_insert<unsigned_long_long>((ulonglong)local_390);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      std::operator<<(local_208,(string *)&jpol_sel);
      std::__cxx11::string::~string((string *)&jpol_sel);
    }
    std::operator<<(local_208," >");
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)&ppi);
    poVar9 = std::operator<<(local_4c0,(string *)&poolOfNextPolicies);
    std::endl<char,std::char_traits<char>>(poVar9);
    std::__cxx11::string::~string((string *)&poolOfNextPolicies);
  }
  boost::detail::shared_count::~shared_count(&pp_p.pn);
  boost::detail::shared_count::~shared_count(&bestJPol.pn);
  return;
}

Assistant:

void GeneralizedMAAStarPlanner::Plan()    
{
    Initialize();

    StartTimer("GMAA::Plan");

    //stuff for timing (if used)
    tms ts_start;   //the time struct
    clock_t tck_start;  //ticks
    tck_start = times(&ts_start);
    //the intermediate timing stream
    ofstream & its = *_m_intermediateResultFile;

    tms ts_before, ts_after;
    times(&ts_before);

    boost::shared_ptr<PartialJointPolicyDiscretePure> bestJPol = NewJPol();

    bestJPol->SetPastReward(-DBL_MAX);
#if DEBUG_GMAA_POLS    
    cout << "GMAA initialized with empty policy:"<<endl;
    bestJPol->Print();
#endif

    // Setup the Policy Pool
    PartialPolicyPoolInterface_sharedPtr pp_p = NewPP(); 
    pp_p->Init( GetThisFromMostDerivedPU() ); //initialize with empty joint policy

    do
    {
        if(_m_deadline)
        {
            times(&ts_after);
            clock_t utime = ts_after.tms_utime -
                ts_before.tms_utime;
            double timeSpentInS=static_cast<double>(utime) / sysconf(_SC_CLK_TCK);
//            cout << timeSpentInS << endl;
            if(timeSpentInS>_m_deadline)
            {
                std::stringstream ss;
                ss << "GeneralizedMAAStarPlanner::Plan() we spent "
                   << timeSpentInS << "s, which is more than the deadline of "
                   << _m_deadline << "s, bailing out...";
                EDeadline e(ss.str());
                throw(e);
            }
        }

        StartTimer("GMAA::Plan::iteration");
        if(_m_saveIntermediateTiming)
            SaveTimers(_m_intermediateTimingFilename);

        if(_m_verboseness >= 2) {
            cout << "\n---------------------------------------------------\n";
            cout << "-->>Start of new GMAA iteration, polpool size="<<
                pp_p->Size()<<"<<--"<<endl;
        }

        PartialPolicyPoolItemInterface_sharedPtr ppi = pp_p->Select();
        boost::shared_ptr<PartialJointPolicyDiscretePure> jpol_sel =  ppi->GetJPol();
        double v_sel = ppi->GetValue();
        size_t depth_sel = jpol_sel->GetDepth();
        if(_m_verboseness >= 3) {
            cout << "GMAA Selected a partial jpol of depth="<< depth_sel << " and heur. val="<<v_sel<<
                " to expand" << endl;
            if(_m_verboseness >= 4) 
                ppi->GetJPol()->Print();
        }
        //cout << "SELECTed partial pol with heur. val="<<v_sel<<endl;
        
        if( (v_sel + _m_slack) < _m_maxLowerBound) //the highest upperbound < the best lower
        {
            //  1)if JPolValPool is no priority queue, this should be changed.
            if(_m_verboseness >= 0)
                cout<<"!!!GMAA::Plan highest upper < best found lower bound, stopping\n";
            break;
        }

        //poolOfNextPolicies     = {<pol,vals>} 
        //isLowerBound  = bool   - whether the vals are lower bounds to the 
        //                optimal value (i.e. value for the optimal policy)
        //<poolOfNextPolicies,isLowerBound>=ConstructAndValuateNextPolicies(ppi)

        PartialPolicyPoolInterface_sharedPtr poolOfNextPolicies = NewPP();
        bool cleanUpPPI=true;
        bool are_LBs =
            ConstructAndValuateNextPolicies(ppi,
                                            poolOfNextPolicies,
                                            cleanUpPPI);

        //this keeps track of the actually expanded *nodes*
        //however, due to our clever stuff we never exand all the nodes anymore
        //so we will need to extract the information of 'non-incremental expansion'
        //from within the CBG solver...
        if(_m_expanded_childs.size()<=depth_sel)
            _m_expanded_childs.resize(depth_sel+1,0);
        _m_expanded_childs.at(depth_sel) += poolOfNextPolicies->Size();

        //Clean up ppi - that is we remove the top element of the policy pool because that was just expanded (right?)
        if(cleanUpPPI)
            pp_p->Pop(ppi);
        else
        {
            pp_p->Pop(ppi);
            pp_p->Insert(ppi);
            
        }

#if DEBUG_GMAA4        
        if(DEBUG_GMAA4){
            cout << "--------------------------------------------------\n"<<
                    ">>>The next policies found, poolOfNextPolicies:"<<endl;
            PartialPolicyPoolInterface_sharedPtr pp_copy = NewPP();
            *pp_copy = *poolOfNextPolicies;
            while(! pp_copy->Empty())
            {
                PartialPolicyPoolItemInterface_sharedPtr it = pp_copy->Select();
                it->Print();
                cout << endl;
                pp_copy->Pop();
            }
            cout << "<<<\n---------------------------------------------"<<endl;
        }
#endif        

        //if(isLowerBound)
        //    Prune( JPolValPool, max(lowerBound) )
        if(are_LBs && poolOfNextPolicies->Size() > 0)
        {
            PartialPolicyPoolItemInterface_sharedPtr bestRanked_ppi = poolOfNextPolicies->
                GetBestRanked();
            poolOfNextPolicies->PopBestRanked();
            double bestNextVal = bestRanked_ppi->GetValue();
            if(bestNextVal > _m_maxLowerBound) //new best lowerbound (and policy) found
            {
                _m_maxLowerBound = bestNextVal;
                *bestJPol = *(bestRanked_ppi->GetJPol());
                if(_m_verboseness >= 2) {
                    cout << "new bestJPol (and max. lowerbound) found! - ";
                    cout << "value v="
                         << bestNextVal <<" - "
                         << bestRanked_ppi->GetJPol()->SoftPrintBrief() << endl;
                }
                if(_m_verboseness >= 4) 
                    cout << "new bestJPol->SoftPrint():"<<bestJPol->SoftPrint();

                //if we maintain the internal timings...
                if(_m_intermediateResultFile != 0)
                {
                    tms ts_cur;
                    clock_t tck_cur;
                    tck_cur = times(&ts_cur);
                    clock_t diff = tck_cur - tck_start;
                    its << diff << "\t" <<  _m_maxLowerBound << endl;
                }
                // prune JPolValPool
                pp_p->Prune(_m_maxLowerBound - _m_slack );
            }
        }
        SelectPoliciesToProcessFurther(poolOfNextPolicies, are_LBs, _m_maxLowerBound - _m_slack);
        pp_p->Union(poolOfNextPolicies);

        if( _m_maxJPolPoolSize < pp_p->Size())
            _m_maxJPolPoolSize = pp_p->Size();
        
        StopTimer("GMAA::Plan::iteration");
        if(_m_verboseness >= 2) { 
            if(_m_maxLowerBound==-DBL_MAX)
                cout << "--GMAA::Plan::iteration ending, polpool size="<<pp_p->Size()<<", no complete policy found yet";
            else
            {
                cout << "--GMAA::Plan::iteration ending, polpool size="<<pp_p->Size()<<", best policy found so far:";
                cout << endl << bestJPol->SoftPrintBrief()  <<endl;
                if(_m_verboseness >= 5)  
                    cout << endl << bestJPol->SoftPrint()  <<endl;
            }
        }
    } 
    while(! pp_p->Empty() ); //<- end do...while

    //we don't want to do any conversions here... takes (sometimes too much)
    //time...
    _m_foundPolicy=bestJPol;  //->ToJointPolicyPureVector());

    _m_expectedRewardFoundPolicy=_m_maxLowerBound;
    if(_m_verboseness >= 1) {
        cout << "\n----GMAA::Plan ending, best policy found:----\n";
        cout << bestJPol->SoftPrintBrief() << " = " <<endl;
        if(_m_verboseness >= 3) 
            cout << _m_foundPolicy->SoftPrint() << endl;
        cout << endl;
        if(_m_verboseness >= 2)
        {
            JPPV_sharedPtr jppv = _m_foundPolicy->ToJointPolicyPureVector();
            jppv->Print();
        }
    }
    if(_m_verboseness >= 2)    
        cout << "\n\n ";
    if(_m_verboseness >= 0)    
        cout << "GMAA::Plan GMAA ENDED"<<endl;
    if(_m_verboseness >= 2)    
        cout << "\n\n ";

    StopTimer("GMAA::Plan");

    if(_m_verboseness >= 0)    
    {
        cout << "Expanded nodes at different stages:\n"<<
            PrintTools::SoftPrintVector(_m_expanded_childs)<<endl;
        cout << "Maximum number of nodes that could have been expanded:\n"<<
            PrintTools::SoftPrintVector(_m_max_expanded_childs)<<endl;
    }
}